

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O2

void __thiscall
bssl::(anonymous_namespace)::ParseCertificatePoliciesExtensionOidsTest_AnyPolicy_Test::
~ParseCertificatePoliciesExtensionOidsTest_AnyPolicy_Test
          (ParseCertificatePoliciesExtensionOidsTest_AnyPolicy_Test *this)

{
  anon_unknown_0::ParseCertificatePoliciesExtensionOidsTest_AnyPolicy_Test::
  ~ParseCertificatePoliciesExtensionOidsTest_AnyPolicy_Test
            ((ParseCertificatePoliciesExtensionOidsTest_AnyPolicy_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest, AnyPolicy) {
  std::string der;
  ASSERT_TRUE(LoadTestData("anypolicy.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_TRUE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
  ASSERT_EQ(1U, policies.size());
  EXPECT_EQ(der::Input(kAnyPolicyOid), policies[0]);
}